

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

bool google::protobuf::Base64UnescapeInternal(char *src,int slen,string *dest,char *unbase64)

{
  uint uVar1;
  LogMessage *other;
  pointer dest_00;
  int szdest;
  LogFinisher local_61;
  LogMessage local_60;
  
  szdest = slen / -4 + slen;
  std::__cxx11::string::resize((ulong)dest);
  if (dest->_M_string_length == 0) {
    dest_00 = (char *)0x0;
  }
  else {
    dest_00 = (dest->_M_dataplus)._M_p;
  }
  uVar1 = Base64UnescapeInternal(src,slen,dest_00,szdest,unbase64);
  if ((int)uVar1 < 0) {
    dest->_M_string_length = 0;
    *(dest->_M_dataplus)._M_p = '\0';
  }
  else {
    if (szdest < (int)uVar1) {
      internal::LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,"third_party/protobuf-lite/strutil.cc",0x819);
      other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (len) <= (dest_len): ");
      internal::LogFinisher::operator=(&local_61,other);
      internal::LogMessage::~LogMessage(&local_60);
    }
    std::__cxx11::string::erase((ulong)dest,(ulong)uVar1);
  }
  return -1 < (int)uVar1;
}

Assistant:

static bool Base64UnescapeInternal(const char *src, int slen, std::string *dest,
                                   const signed char *unbase64) {
  // Determine the size of the output string.  Base64 encodes every 3 bytes into
  // 4 characters.  any leftover chars are added directly for good measure.
  // This is documented in the base64 RFC: http://tools.ietf.org/html/rfc3548
  const int dest_len = 3 * (slen / 4) + (slen % 4);

  dest->resize(dest_len);

  // We are getting the destination buffer by getting the beginning of the
  // string and converting it into a char *.
  const int len = Base64UnescapeInternal(src, slen, string_as_array(dest),
                                         dest_len, unbase64);
  if (len < 0) {
    dest->clear();
    return false;
  }

  // could be shorter if there was padding
  GOOGLE_DCHECK_LE(len, dest_len);
  dest->erase(len);

  return true;
}